

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O0

NumberParseMatcher * __thiscall
icu_63::numparse::impl::AffixTokenMatcherWarehouse::minusSign(AffixTokenMatcherWarehouse *this)

{
  MinusSignMatcher *pMVar1;
  MinusSignMatcher local_68;
  AffixTokenMatcherWarehouse *local_10;
  AffixTokenMatcherWarehouse *this_local;
  
  local_10 = this;
  MinusSignMatcher::MinusSignMatcher(&local_68,this->fSetupData->dfs,true);
  pMVar1 = MinusSignMatcher::operator=(&this->fMinusSign,&local_68);
  MinusSignMatcher::~MinusSignMatcher(&local_68);
  return (NumberParseMatcher *)pMVar1;
}

Assistant:

NumberParseMatcher& AffixTokenMatcherWarehouse::minusSign() {
    return fMinusSign = {fSetupData->dfs, true};
}